

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O0

ostream * operator<<(ostream *out,LinearSystem *system)

{
  string local_68;
  string local_38;
  LinearSystem *local_18;
  LinearSystem *system_local;
  ostream *out_local;
  
  local_18 = system;
  system_local = (LinearSystem *)out;
  if (Options::output_type == 0) {
    LinearSystem::ToString_abi_cxx11_(&local_38,system);
    std::operator<<(out,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else if (Options::output_type == 1) {
    LinearSystem::ToLaTex_abi_cxx11_(&local_68,system);
    std::operator<<(out,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return (ostream *)system_local;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const LinearSystem& system) {
  if (Options::output_type == Options::OutputType::Standard) {
    out << system.ToString();
  } else if (Options::output_type == Options::OutputType::LaTex) {
    out << system.ToLaTex();
  }

  return out;
}